

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O0

void __thiscall SDLFB::UpdateColors(SDLFB *this)

{
  PalEntry *local_840;
  int local_82c;
  PalEntry local_828;
  int i_1;
  SDL_Color colors [256];
  int local_41c;
  PalEntry local_418;
  int i;
  PalEntry palette [256];
  SDLFB *this_local;
  
  if ((this->NotPaletted & 1U) == 0) {
    for (local_82c = 0; local_82c < 0x100; local_82c = local_82c + 1) {
      (&local_828)[local_82c].field_0.field_0.b =
           this->GammaTable[0][this->SourcePalette[local_82c].field_0.field_0.r];
      (&local_828)[local_82c].field_0.field_0.g =
           this->GammaTable[1][this->SourcePalette[local_82c].field_0.field_0.g];
      (&local_828)[local_82c].field_0.field_0.r =
           this->GammaTable[2][this->SourcePalette[local_82c].field_0.field_0.b];
    }
    if (this->FlashAmount != 0) {
      DoBlending(&local_828,&local_828,0x100,
                 (uint)this->GammaTable[2][(this->Flash).field_0.field_0.b],
                 (uint)this->GammaTable[1][(this->Flash).field_0.field_0.g],
                 (uint)this->GammaTable[0][(this->Flash).field_0.field_0.r],this->FlashAmount);
    }
    SDL_SetPaletteColors(((this->field_8).Surface)->format->palette,&local_828,0,0x100);
  }
  else {
    local_840 = &local_418;
    do {
      PalEntry::PalEntry(local_840);
      local_840 = local_840 + 1;
    } while (local_840 != palette + 0xfe);
    for (local_41c = 0; local_41c < 0x100; local_41c = local_41c + 1) {
      (&local_418)[local_41c].field_0.field_0.r =
           this->GammaTable[0][this->SourcePalette[local_41c].field_0.field_0.r];
      (&local_418)[local_41c].field_0.field_0.g =
           this->GammaTable[1][this->SourcePalette[local_41c].field_0.field_0.g];
      (&local_418)[local_41c].field_0.field_0.b =
           this->GammaTable[2][this->SourcePalette[local_41c].field_0.field_0.b];
    }
    if (this->FlashAmount != 0) {
      DoBlending(&local_418,&local_418,0x100,
                 (uint)this->GammaTable[0][(this->Flash).field_0.field_0.r],
                 (uint)this->GammaTable[1][(this->Flash).field_0.field_0.g],
                 (uint)this->GammaTable[2][(this->Flash).field_0.field_0.b],this->FlashAmount);
    }
    (*GPfx.SetPalette)(&local_418);
  }
  return;
}

Assistant:

void SDLFB::UpdateColors ()
{
	if (NotPaletted)
	{
		PalEntry palette[256];
		
		for (int i = 0; i < 256; ++i)
		{
			palette[i].r = GammaTable[0][SourcePalette[i].r];
			palette[i].g = GammaTable[1][SourcePalette[i].g];
			palette[i].b = GammaTable[2][SourcePalette[i].b];
		}
		if (FlashAmount)
		{
			DoBlending (palette, palette,
				256, GammaTable[0][Flash.r], GammaTable[1][Flash.g], GammaTable[2][Flash.b],
				FlashAmount);
		}
		GPfx.SetPalette (palette);
	}
	else
	{
		SDL_Color colors[256];
		
		for (int i = 0; i < 256; ++i)
		{
			colors[i].r = GammaTable[0][SourcePalette[i].r];
			colors[i].g = GammaTable[1][SourcePalette[i].g];
			colors[i].b = GammaTable[2][SourcePalette[i].b];
		}
		if (FlashAmount)
		{
			DoBlending ((PalEntry *)colors, (PalEntry *)colors,
				256, GammaTable[2][Flash.b], GammaTable[1][Flash.g], GammaTable[0][Flash.r],
				FlashAmount);
		}
		SDL_SetPaletteColors (Surface->format->palette, colors, 0, 256);
	}
}